

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

uint32_t efsctsiz(CPUPPCState_conflict *env,uint32_t val)

{
  int iVar1;
  CPU_FloatU u;
  uint32_t val_local;
  CPUPPCState_conflict *env_local;
  
  iVar1 = float32_is_quiet_nan_ppc(val,&env->vec_status);
  if (iVar1 == 0) {
    env_local._4_4_ = float32_to_int32_round_to_zero_ppc(val,&env->vec_status);
  }
  else {
    env_local._4_4_ = 0;
  }
  return env_local._4_4_;
}

Assistant:

static inline uint32_t efsctsiz(CPUPPCState *env, uint32_t val)
{
    CPU_FloatU u;

    u.l = val;
    /* NaN are not treated the same way IEEE 754 does */
    if (unlikely(float32_is_quiet_nan(u.f, &env->vec_status))) {
        return 0;
    }

    return float32_to_int32_round_to_zero(u.f, &env->vec_status);
}